

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O1

char position_window(Fl_Window *w,char *prefsName,int Visible,int X,int Y,int W,int H)

{
  char cVar1;
  Fl_Preferences pos;
  uint local_30;
  uint local_2c;
  uint local_28;
  int local_24;
  Fl_Preferences local_20;
  
  local_30 = W;
  local_2c = Y;
  local_28 = X;
  local_24 = Visible;
  Fl_Preferences::Fl_Preferences(&local_20,&fluid_prefs,prefsName);
  if ((prevpos_button->super_Fl_Light_Button).super_Fl_Button.value_ != '\0') {
    Fl_Preferences::get(&local_20,"x",(int *)&local_28,local_28);
    Fl_Preferences::get(&local_20,"y",(int *)&local_2c,local_2c);
    if (local_30 == 0) {
      (*(w->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
                (w,(ulong)local_28,(ulong)local_2c,
                 (ulong)(uint)(w->super_Fl_Group).super_Fl_Widget.w_,
                 (ulong)(uint)(w->super_Fl_Group).super_Fl_Widget.h_);
    }
    else {
      Fl_Preferences::get(&local_20,"w",(int *)&local_30,local_30);
      Fl_Preferences::get(&local_20,"h",&H,H);
      (*(w->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
                (w,(ulong)local_28,(ulong)local_2c,(ulong)local_30,(ulong)(uint)H);
    }
  }
  Fl_Preferences::get(&local_20,"visible",&local_24,local_24);
  cVar1 = (char)local_24;
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&local_20);
  return cVar1;
}

Assistant:

char position_window(Fl_Window *w, const char *prefsName, int Visible, int X, int Y, int W=0, int H=0 ) {
  Fl_Preferences pos(fluid_prefs, prefsName);
  if (prevpos_button->value()) {
    pos.get("x", X, X);
    pos.get("y", Y, Y);
    if ( W!=0 ) {
      pos.get("w", W, W);
      pos.get("h", H, H);
      w->resize( X, Y, W, H );
    }
    else
      w->position( X, Y );
  }
  pos.get("visible", Visible, Visible);
  return Visible;
}